

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_union(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int min;
  rle16_t local_40;
  rle16_t newrl;
  rle16_t local_34;
  int local_30;
  rle16_t previousrle;
  int32_t xrlepos;
  int32_t rlepos;
  int32_t neededcapacity;
  _Bool if2;
  _Bool if1;
  run_container_t *dst_local;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  _Var2 = run_container_is_full(src_1);
  _Var3 = run_container_is_full(src_2);
  if ((_Var2) || (_Var3)) {
    if (_Var2) {
      run_container_copy(src_1,dst);
      return;
    }
    if (_Var3) {
      run_container_copy(src_2,dst);
      return;
    }
  }
  min = src_1->n_runs + src_2->n_runs;
  if (dst->capacity < min) {
    run_container_grow(dst,min,false);
  }
  dst->n_runs = 0;
  previousrle.value = 0;
  previousrle.length = 0;
  local_30 = 0;
  if (src_2->runs->value < src_1->runs->value) {
    local_34 = run_container_append_first(dst,*src_2->runs);
    local_30 = local_30 + 1;
  }
  else {
    local_34 = run_container_append_first(dst,*src_1->runs);
    previousrle = (rle16_t)((int)previousrle + 1);
  }
  while( true ) {
    bVar1 = false;
    if (local_30 < src_2->n_runs) {
      bVar1 = (int)previousrle < src_1->n_runs;
    }
    if (!bVar1) break;
    if (src_2->runs[local_30].value < src_1->runs[(int)previousrle].value) {
      local_40 = src_2->runs[local_30];
      local_30 = local_30 + 1;
    }
    else {
      local_40 = src_1->runs[(int)previousrle];
      previousrle = (rle16_t)((int)previousrle + 1);
    }
    run_container_append(dst,local_40,&local_34);
  }
  for (; local_30 < src_2->n_runs; local_30 = local_30 + 1) {
    run_container_append(dst,src_2->runs[local_30],&local_34);
  }
  for (; (int)previousrle < src_1->n_runs; previousrle = (rle16_t)((int)previousrle + 1)) {
    run_container_append(dst,src_1->runs[(int)previousrle],&local_34);
  }
  return;
}

Assistant:

void run_container_union(const run_container_t *src_1,
                         const run_container_t *src_2, run_container_t *dst) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_1, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_2, dst);
            return;
        }
    }
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(dst, src_1->runs[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(dst, src_2->runs[xrlepos]);
        xrlepos++;
    }

    while ((xrlepos < src_2->n_runs) && (rlepos < src_1->n_runs)) {
        rle16_t newrl;
        if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = src_1->runs[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(dst, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(dst, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < src_1->n_runs) {
        run_container_append(dst, src_1->runs[rlepos], &previousrle);
        rlepos++;
    }
}